

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

int det_4d_filter(double *p0,double *p1,double *p2,double *p3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  double dVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  
  dVar8 = p0[2];
  dVar1 = p1[2];
  dVar2 = p2[2];
  dVar3 = p3[2];
  dVar10 = *p0;
  dVar24 = p0[1];
  dVar4 = *p1;
  dVar5 = p1[1];
  dVar23 = *p2;
  dVar6 = p2[1];
  dVar13 = *p3;
  dVar18 = p3[1];
  auVar16._0_8_ = ABS(dVar10);
  auVar16._8_8_ = ABS(dVar24);
  auVar15._0_8_ = ABS(dVar4);
  auVar15._8_8_ = ABS(dVar5);
  auVar16 = maxpd(auVar15,auVar16);
  auVar19._0_8_ = ABS(dVar23);
  auVar19._8_8_ = ABS(dVar6);
  auVar16 = maxpd(auVar19,auVar16);
  auVar11._0_8_ = ABS(dVar13);
  auVar11._8_8_ = ABS(dVar18);
  auVar16 = maxpd(auVar11,auVar16);
  dVar20 = ABS(dVar1);
  if (ABS(dVar1) <= ABS(dVar8)) {
    dVar20 = ABS(dVar8);
  }
  dVar17 = ABS(dVar2);
  if (ABS(dVar2) <= dVar20) {
    dVar17 = dVar20;
  }
  dVar20 = ABS(dVar3);
  if (ABS(dVar3) <= dVar17) {
    dVar20 = dVar17;
  }
  dVar14 = ABS(p0[3]);
  dVar17 = ABS(p1[3]);
  if (dVar17 <= dVar14) {
    dVar17 = dVar14;
  }
  dVar14 = ABS(p2[3]);
  if (dVar14 <= dVar17) {
    dVar14 = dVar17;
  }
  dVar17 = ABS(p3[3]);
  dVar12 = auVar16._8_8_;
  dVar9 = auVar16._0_8_;
  dVar21 = dVar12;
  dVar22 = dVar9;
  if ((dVar9 <= dVar12) && (dVar21 = dVar9, dVar22 = dVar12, dVar12 <= dVar9)) {
    dVar22 = dVar9;
  }
  if (dVar17 <= dVar14) {
    dVar17 = dVar14;
  }
  dVar14 = dVar20;
  if ((dVar21 <= dVar20) && (dVar14 = dVar21, dVar22 < dVar20)) {
    dVar22 = dVar20;
  }
  dVar21 = dVar17;
  if ((dVar14 <= dVar17) && (dVar21 = dVar14, dVar22 < dVar17)) {
    dVar22 = dVar17;
  }
  iVar7 = 0;
  if ((3.2040245907439903e-74 <= dVar21) && (dVar22 <= 1.447401115466452e+76)) {
    dVar14 = dVar13 * dVar24 - dVar18 * dVar10;
    dVar21 = dVar13 * dVar5 - dVar18 * dVar4;
    dVar13 = dVar13 * dVar6 - dVar18 * dVar23;
    dVar18 = dVar23 * dVar24 - dVar6 * dVar10;
    dVar23 = dVar23 * dVar5 - dVar6 * dVar4;
    dVar24 = dVar24 * dVar4 - dVar5 * dVar10;
    dVar10 = dVar9 * dVar12 * dVar20 * dVar17 * 2.111354066053168e-14;
    dVar8 = ((dVar3 * dVar24 + (dVar21 * dVar8 - dVar14 * dVar1)) * p2[3] +
            ((dVar23 * dVar3 + (dVar13 * dVar1 - dVar2 * dVar21)) * p0[3] -
            p1[3] * (dVar18 * dVar3 + (dVar13 * dVar8 - dVar2 * dVar14)))) -
            (dVar24 * dVar2 + (dVar23 * dVar8 - dVar1 * dVar18)) * p3[3];
    iVar7 = 1;
    if ((dVar8 <= dVar10) && (iVar7 = 0, dVar8 < -dVar10)) {
      iVar7 = -1;
    }
  }
  return iVar7;
}

Assistant:

inline int det_4d_filter( const double* p0, const double* p1, const double* p2, const double* p3) {
    double m12;
    m12 = ((p1[0] * p0[1]) - (p0[0] * p1[1]));
    double m13;
    m13 = ((p2[0] * p0[1]) - (p0[0] * p2[1]));
    double m14;
    m14 = ((p3[0] * p0[1]) - (p0[0] * p3[1]));
    double m23;
    m23 = ((p2[0] * p1[1]) - (p1[0] * p2[1]));
    double m24;
    m24 = ((p3[0] * p1[1]) - (p1[0] * p3[1]));
    double m34;
    m34 = ((p3[0] * p2[1]) - (p2[0] * p3[1]));
    double m123;
    m123 = (((m23 * p0[2]) - (m13 * p1[2])) + (m12 * p2[2]));
    double m124;
    m124 = (((m24 * p0[2]) - (m14 * p1[2])) + (m12 * p3[2]));
    double m134;
    m134 = (((m34 * p0[2]) - (m14 * p2[2])) + (m13 * p3[2]));
    double m234;
    m234 = (((m34 * p1[2]) - (m24 * p2[2])) + (m23 * p3[2]));
    double Delta;
    Delta = ((((m234 * p0[3]) - (m134 * p1[3])) + (m124 * p2[3])) - (m123 * p3[3]));
    int int_tmp_result;
    double eps;
    double max1 = fabs(p0[0]);
    if( (max1 < fabs(p1[0])) )
    {
        max1 = fabs(p1[0]);
    } 
    if( (max1 < fabs(p2[0])) )
    {
        max1 = fabs(p2[0]);
    } 
    if( (max1 < fabs(p3[0])) )
    {
        max1 = fabs(p3[0]);
    } 
    double max2 = fabs(p0[1]);
    if( (max2 < fabs(p1[1])) )
    {
        max2 = fabs(p1[1]);
    } 
    if( (max2 < fabs(p2[1])) )
    {
        max2 = fabs(p2[1]);
    } 
    if( (max2 < fabs(p3[1])) )
    {
        max2 = fabs(p3[1]);
    } 
    double max3 = fabs(p0[2]);
    if( (max3 < fabs(p1[2])) )
    {
        max3 = fabs(p1[2]);
    } 
    if( (max3 < fabs(p2[2])) )
    {
        max3 = fabs(p2[2]);
    } 
    if( (max3 < fabs(p3[2])) )
    {
        max3 = fabs(p3[2]);
    } 
    double max4 = fabs(p0[3]);
    if( (max4 < fabs(p1[3])) )
    {
        max4 = fabs(p1[3]);
    } 
    if( (max4 < fabs(p2[3])) )
    {
        max4 = fabs(p2[3]);
    } 
    if( (max4 < fabs(p3[3])) )
    {
        max4 = fabs(p3[3]);
    } 
    double lower_bound_1;
    double upper_bound_1;
    lower_bound_1 = max1;
    upper_bound_1 = max1;
    if( (max2 < lower_bound_1) )
    {
        lower_bound_1 = max2;
    } 
    else 
    {
        if( (max2 > upper_bound_1) )
        {
            upper_bound_1 = max2;
        } 
    } 
    if( (max3 < lower_bound_1) )
    {
        lower_bound_1 = max3;
    } 
    else 
    {
        if( (max3 > upper_bound_1) )
        {
            upper_bound_1 = max3;
        } 
    } 
    if( (max4 < lower_bound_1) )
    {
        lower_bound_1 = max4;
    } 
    else 
    {
        if( (max4 > upper_bound_1) )
        {
            upper_bound_1 = max4;
        } 
    } 
    if( (lower_bound_1 < 3.20402459074399025456e-74) )
    {
        return FPG_UNCERTAIN_VALUE;
    } 
    else 
    {
        if( (upper_bound_1 > 1.44740111546645196071e+76) )
        {
            return FPG_UNCERTAIN_VALUE;
        } 
        eps = (2.11135406605316806158e-14 * (((max1 * max2) * max3) * max4));
        if( (Delta > eps) )
        {
            int_tmp_result = 1;
        } 
        else 
        {
            if( (Delta < -eps) )
            {
                int_tmp_result = -1;
            } 
            else 
            {
                return FPG_UNCERTAIN_VALUE;
            } 
        } 
    } 
    return int_tmp_result;
}